

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint seglen;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  undefined1 auVar18 [32];
  __m256i *palVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  parasail_result_t *result;
  __m256i *palVar24;
  __m256i *palVar25;
  __m256i *palVar26;
  __m256i *palVar27;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *palVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  __m256i *palVar32;
  char *__format;
  ulong uVar33;
  int iVar34;
  int32_t iVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  __m256i *palVar39;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  int iVar69;
  __m256i *local_3b8;
  __m256i *local_3b0;
  __m256i *local_3a0;
  __m256i *local_398;
  __m256i *local_390;
  __m256i *local_388;
  __m256i *local_380;
  __m256i *local_378;
  __m256i *local_370;
  __m256i *local_368;
  ulong local_360;
  undefined1 local_318 [32];
  __m256i *local_2f8;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar31 = "profile";
  }
  else {
    pvVar7 = (profile->profile32).score;
    if (pvVar7 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar31 = "profile->profile32.score";
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar31 = "profile->matrix";
      }
      else {
        uVar23 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar31 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar9 = (profile->profile32).matches;
            pvVar10 = (profile->profile32).similar;
            iVar29 = ppVar8->max;
            result = parasail_result_new_table3((uint)(uVar23 + 7) & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              uVar37 = uVar23 + 7 >> 3;
              result->flag = result->flag | 0x8430804;
              palVar24 = parasail_memalign___m256i(0x20,uVar37);
              local_368 = parasail_memalign___m256i(0x20,uVar37);
              local_3b0 = parasail_memalign___m256i(0x20,uVar37);
              palVar25 = parasail_memalign___m256i(0x20,uVar37);
              local_3b8 = parasail_memalign___m256i(0x20,uVar37);
              palVar26 = parasail_memalign___m256i(0x20,uVar37);
              local_3a0 = parasail_memalign___m256i(0x20,uVar37);
              palVar27 = parasail_memalign___m256i(0x20,uVar37);
              b = parasail_memalign___m256i(0x20,uVar37);
              b_00 = parasail_memalign___m256i(0x20,uVar37);
              b_01 = parasail_memalign___m256i(0x20,uVar37);
              b_02 = parasail_memalign___m256i(0x20,uVar37);
              palVar28 = parasail_memalign___m256i(0x20,uVar37);
              local_378 = parasail_memalign___m256i(0x20,uVar37);
              local_370 = parasail_memalign___m256i(0x20,uVar37);
              local_380 = parasail_memalign___m256i(0x20,uVar37);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = palVar24;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_368;
              auVar58 = vpunpcklqdq_avx(auVar58,auVar59);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = local_3b0;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = palVar25;
              auVar59 = vpunpcklqdq_avx(auVar40,auVar43);
              auVar40 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar58;
              auVar43 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = local_3b8;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = palVar26;
              auVar58 = vpunpcklqdq_avx(auVar44,auVar49);
              auVar50._8_8_ = 0;
              auVar50._0_8_ = local_3a0;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = palVar27;
              auVar59 = vpunpcklqdq_avx(auVar50,auVar54);
              auVar44 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar58;
              auVar49 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = b;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = b_00;
              auVar58 = vpunpcklqdq_avx(auVar53,auVar55);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = b_01;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_02;
              auVar59 = vpunpcklqdq_avx(auVar56,auVar60);
              auVar50 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar58;
              auVar53 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = palVar28;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_378;
              auVar58 = vpunpcklqdq_avx(auVar57,auVar61);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_370;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = local_380;
              auVar59 = vpunpcklqdq_avx(auVar62,auVar63);
              auVar58 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar58;
              auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
              auVar41._0_8_ = -(ulong)(auVar40._0_8_ == 0);
              auVar41._8_8_ = -(ulong)(auVar40._8_8_ == 0);
              auVar41._16_8_ = -(ulong)(auVar43._0_8_ == 0);
              auVar41._24_8_ = -(ulong)(auVar43._8_8_ == 0);
              auVar45._0_8_ = -(ulong)(auVar44._0_8_ == 0);
              auVar45._8_8_ = -(ulong)(auVar44._8_8_ == 0);
              auVar45._16_8_ = -(ulong)(auVar49._0_8_ == 0);
              auVar45._24_8_ = -(ulong)(auVar49._8_8_ == 0);
              auVar41 = vpackssdw_avx2(auVar41,auVar45);
              auVar45 = vpermq_avx2(auVar41,0xd8);
              auVar46._0_8_ = -(ulong)(auVar50._0_8_ == 0);
              auVar46._8_8_ = -(ulong)(auVar50._8_8_ == 0);
              auVar46._16_8_ = -(ulong)(auVar53._0_8_ == 0);
              auVar46._24_8_ = -(ulong)(auVar53._8_8_ == 0);
              auVar51._0_8_ = -(ulong)(auVar58._0_8_ == 0);
              auVar51._8_8_ = -(ulong)(auVar58._8_8_ == 0);
              auVar51._16_8_ = -(ulong)(auVar59._0_8_ == 0);
              auVar51._24_8_ = -(ulong)(auVar59._8_8_ == 0);
              auVar41 = vpackssdw_avx2(auVar46,auVar51);
              auVar41 = vpermq_avx2(auVar41,0xd8);
              auVar41 = vpackssdw_avx2(auVar45,auVar41);
              if ((((((((((((((((auVar41 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar41 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar41 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar41 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar41 >> 0x7f,0) == '\0') &&
                        (auVar41 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar41 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar41 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar41 >> 0xbf,0) == '\0') &&
                    (auVar41 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar41 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar41 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar41[0x1f]) {
                local_360 = 0;
                alVar1[0]._4_4_ = in_stack_fffffffffffffc2c;
                alVar1[0]._0_4_ = in_stack_fffffffffffffc28;
                alVar1[1] = (longlong)palVar28;
                alVar1[2] = (longlong)palVar26;
                alVar1[3] = (longlong)local_3a0;
                parasail_memset___m256i(palVar24,alVar1,uVar37);
                alVar2[0]._4_4_ = in_stack_fffffffffffffc2c;
                alVar2[0]._0_4_ = in_stack_fffffffffffffc28;
                alVar2[1] = (longlong)palVar28;
                alVar2[2] = (longlong)palVar26;
                alVar2[3] = (longlong)local_3a0;
                parasail_memset___m256i(local_3b0,alVar2,uVar37);
                alVar3[0]._4_4_ = in_stack_fffffffffffffc2c;
                alVar3[0]._0_4_ = in_stack_fffffffffffffc28;
                alVar3[1] = (longlong)palVar28;
                alVar3[2] = (longlong)palVar26;
                alVar3[3] = (longlong)local_3a0;
                parasail_memset___m256i(local_3b8,alVar3,uVar37);
                alVar4[0]._4_4_ = in_stack_fffffffffffffc2c;
                alVar4[0]._0_4_ = in_stack_fffffffffffffc28;
                alVar4[1] = (longlong)palVar28;
                alVar4[2] = (longlong)palVar26;
                alVar4[3] = (longlong)local_3a0;
                parasail_memset___m256i(local_3a0,alVar4,uVar37);
                c[0]._4_4_ = in_stack_fffffffffffffc2c;
                c[0]._0_4_ = in_stack_fffffffffffffc28;
                c[1] = (longlong)palVar28;
                c[2] = (longlong)palVar26;
                c[3] = (longlong)local_3a0;
                parasail_memset___m256i(b,c,uVar37);
                c_00[0]._4_4_ = in_stack_fffffffffffffc2c;
                c_00[0]._0_4_ = in_stack_fffffffffffffc28;
                c_00[1] = (longlong)palVar28;
                c_00[2] = (longlong)palVar26;
                c_00[3] = (longlong)local_3a0;
                parasail_memset___m256i(b_00,c_00,uVar37);
                c_01[0]._4_4_ = in_stack_fffffffffffffc2c;
                c_01[0]._0_4_ = in_stack_fffffffffffffc28;
                c_01[1] = (longlong)palVar28;
                c_01[2] = (longlong)palVar26;
                c_01[3] = (longlong)local_3a0;
                parasail_memset___m256i(b_01,c_01,uVar37);
                c_02[0]._4_4_ = in_stack_fffffffffffffc2c;
                c_02[0]._0_4_ = in_stack_fffffffffffffc28;
                c_02[1] = (longlong)palVar28;
                c_02[2] = (longlong)palVar26;
                c_02[3] = (longlong)local_3a0;
                parasail_memset___m256i(b_02,c_02,uVar37);
                seglen = (uint)uVar37;
                uVar20 = seglen - 1;
                iVar69 = -0x40000000;
                uVar33 = 0;
                auVar52 = ZEXT1664((undefined1  [16])0x0);
                auVar48 = ZEXT1664((undefined1  [16])0x0);
                auVar66 = ZEXT1664((undefined1  [16])0x0);
                do {
                  local_388 = palVar24;
                  auVar41 = auVar66._0_32_;
                  if (uVar33 == (uint)s2Len) {
                    local_398 = local_3b8;
                    local_390 = local_3b0;
LAB_00799bb1:
                    palVar19 = local_390;
                    palVar32 = local_398;
                    palVar24 = local_3a0;
                    if ((iVar69 == 0x7fffffff) ||
                       (auVar42._8_4_ = 0x7fffffff, auVar42._0_8_ = 0x7fffffff7fffffff,
                       auVar42._12_4_ = 0x7fffffff, auVar42._16_4_ = 0x7fffffff,
                       auVar42._20_4_ = 0x7fffffff, auVar42._24_4_ = 0x7fffffff,
                       auVar42._28_4_ = 0x7fffffff, auVar41 = vpcmpeqd_avx2(auVar41,auVar42),
                       (((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                            (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          SUB321(auVar41 >> 0x7f,0) != '\0') ||
                         (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        SUB321(auVar41 >> 0xbf,0) != '\0') ||
                       (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       auVar41[0x1f] < '\0')) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar22 = parasail_result_is_saturated(result);
                    iVar29 = 0;
                    palVar39 = palVar28;
                    local_2f8 = palVar27;
                    local_318._0_8_ = palVar25;
                    if (iVar22 == 0) {
                      if ((int)local_360 == s2Len + -1) {
                        local_3a0 = local_380;
                        local_398 = local_370;
                        local_390 = local_378;
                        local_378 = palVar19;
                        local_380 = palVar24;
                        palVar39 = local_388;
                        local_388 = palVar28;
                      }
                      else {
                        palVar32 = local_370;
                        if ((int)local_360 == s2Len + -2) {
                          local_2f8 = local_380;
                          local_318._0_8_ = local_378;
                          palVar32 = palVar26;
                          local_378 = palVar25;
                          local_380 = palVar27;
                          palVar39 = local_368;
                          palVar26 = local_370;
                          local_368 = palVar28;
                        }
                      }
                      iVar29 = -0x40000000;
                      uVar37 = 0;
                      iVar21 = -0x40000000;
                      iVar22 = -0x40000000;
                      while( true ) {
                        iVar34 = (int)uVar23;
                        if ((seglen & 0xfffffff) << 3 == (uint)uVar37) break;
                        if ((*(int *)((long)*palVar39 + uVar37 * 4) == iVar69) &&
                           (uVar20 = ((uint)uVar37 & 7) * seglen +
                                     ((uint)(uVar37 >> 3) & 0x1fffffff), (int)uVar20 < iVar34)) {
                          iVar22 = *(int *)((long)*local_378 + uVar37 * 4);
                          iVar29 = *(int *)((long)*palVar32 + uVar37 * 4);
                          iVar21 = *(int *)((long)*local_380 + uVar37 * 4);
                          uVar23 = (ulong)uVar20;
                        }
                        uVar37 = uVar37 + 1;
                      }
                    }
                    else {
                      iVar21 = 0;
                      iVar22 = 0;
                      iVar69 = 0;
                      local_360._0_4_ = 0;
                      iVar34 = 0;
                      palVar32 = local_370;
                    }
                    result->score = iVar69;
                    result->end_query = iVar34;
                    result->end_ref = (int)local_360;
                    ((result->field_4).stats)->matches = iVar22;
                    ((result->field_4).stats)->similar = iVar29;
                    ((result->field_4).stats)->length = iVar21;
                    parasail_free(local_380);
                    parasail_free(palVar32);
                    parasail_free(local_378);
                    parasail_free(palVar39);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(b);
                    parasail_free(local_2f8);
                    parasail_free(local_3a0);
                    parasail_free(palVar26);
                    parasail_free(local_398);
                    parasail_free((void *)local_318._0_8_);
                    parasail_free(local_390);
                    parasail_free(local_368);
                    parasail_free(local_388);
                    return result;
                  }
                  auVar42 = auVar48._0_32_;
                  local_318 = auVar52._0_32_;
                  alVar1 = local_388[uVar20];
                  alVar2 = local_3b0[uVar20];
                  alVar3 = local_3b8[uVar20];
                  alVar4 = local_3a0[uVar20];
                  auVar41 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar41 = vpalignr_avx2((undefined1  [32])alVar1,auVar41,0xc);
                  auVar45 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar45 = vpalignr_avx2((undefined1  [32])alVar2,auVar45,0xc);
                  auVar46 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar46 = vpalignr_avx2((undefined1  [32])alVar3,auVar46,0xc);
                  auVar51 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                  lVar30 = (long)(int)(ppVar8->mapper[(byte)s2[uVar33]] * seglen) * 0x20;
                  iVar22 = (int)uVar33;
                  iVar21 = iVar22 + -2;
                  local_390 = palVar25;
                  palVar32 = palVar27;
                  local_398 = palVar26;
                  if ((int)local_360 == iVar21) {
                    local_390 = local_378;
                    palVar32 = local_380;
                    local_380 = palVar27;
                    local_378 = palVar25;
                    local_398 = local_370;
                  }
                  auVar51 = vpalignr_avx2((undefined1  [32])alVar4,auVar51,0xc);
                  palVar24 = local_368;
                  if ((int)local_360 == iVar21) {
                    palVar24 = palVar28;
                  }
                  auVar48 = ZEXT1664((undefined1  [16])0x0);
                  iVar35 = 0;
                  auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar11._8_8_ = 0x100000001;
                  auVar11._0_8_ = 0x100000001;
                  auVar11._16_8_ = 0x100000001;
                  auVar11._24_8_ = 0x100000001;
                  palVar25 = palVar26;
                  palVar27 = local_3a0;
                  for (lVar38 = 0; uVar37 << 5 != lVar38; lVar38 = lVar38 + 0x20) {
                    auVar47 = *(undefined1 (*) [32])((long)*b + lVar38);
                    auVar67 = *(undefined1 (*) [32])((long)*b_00 + lVar38);
                    auVar5 = *(undefined1 (*) [32])((long)*b_01 + lVar38);
                    auVar6 = *(undefined1 (*) [32])((long)*b_02 + lVar38);
                    auVar41 = vpaddd_avx2(auVar41,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar38 + lVar30));
                    auVar41 = vpmaxsd_avx2(auVar41,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar15 = vpmaxsd_avx2(auVar41,auVar47);
                    auVar64 = auVar48._0_32_;
                    auVar16 = vpmaxsd_avx2(auVar15,auVar64);
                    *(undefined1 (*) [32])((long)*palVar24 + lVar38) = auVar16;
                    auVar12 = vpcmpeqd_avx2(auVar16,auVar41);
                    auVar14 = vpcmpgtd_avx2(auVar15,auVar64);
                    auVar41 = vblendvps_avx(auVar52._0_32_,auVar67,auVar14);
                    auVar45 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar38 + lVar30));
                    auVar41 = vblendvps_avx(auVar41,auVar45,auVar12);
                    auVar13 = vpcmpeqd_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar15 = vpandn_avx2(auVar13,auVar41);
                    *(undefined1 (*) [32])((long)*local_390 + lVar38) = auVar15;
                    auVar41 = vblendvps_avx(auVar68._0_32_,auVar5,auVar14);
                    auVar45 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar38 + lVar30));
                    auVar41 = vblendvps_avx(auVar41,auVar45,auVar12);
                    auVar45 = vblendvps_avx(auVar11,auVar6,auVar14);
                    auVar46 = vpcmpeqd_avx2(auVar14,auVar14);
                    auVar46 = vpsubd_avx2(auVar51,auVar46);
                    auVar45 = vblendvps_avx(auVar45,auVar46,auVar12);
                    auVar51 = vpandn_avx2(auVar13,auVar41);
                    *(undefined1 (*) [32])((long)*local_398 + lVar38) = auVar51;
                    auVar46 = vpandn_avx2(auVar13,auVar45);
                    *(undefined1 (*) [32])((long)*palVar32 + lVar38) = auVar46;
                    auVar41 = vpmaxsd_avx2(auVar66._0_32_,auVar15);
                    auVar45 = vpmaxsd_avx2(auVar51,auVar46);
                    auVar13 = vpmaxsd_avx2(auVar41,auVar45);
                    vH[0]._4_4_ = iVar69;
                    vH[0]._0_4_ = in_stack_fffffffffffffc28;
                    vH[1] = (longlong)palVar28;
                    vH[2] = (longlong)palVar25;
                    vH[3] = (longlong)palVar27;
                    auVar65 = auVar15;
                    arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 8),vH,
                              iVar35,seglen,iVar22,s2Len);
                    vH_00[0]._4_4_ = iVar69;
                    vH_00[0]._0_4_ = in_stack_fffffffffffffc28;
                    vH_00[1] = (longlong)palVar28;
                    vH_00[2] = (longlong)palVar25;
                    vH_00[3] = (longlong)palVar27;
                    arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x10),
                              vH_00,iVar35,seglen,iVar22,s2Len);
                    vH_01[0]._4_4_ = iVar69;
                    vH_01[0]._0_4_ = in_stack_fffffffffffffc28;
                    vH_01[1] = (longlong)palVar28;
                    vH_01[2] = (longlong)palVar25;
                    vH_01[3] = (longlong)palVar27;
                    palVar26 = palVar25;
                    arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x18),
                              vH_01,iVar35,seglen,iVar22,s2Len);
                    vH_02[0]._4_4_ = iVar69;
                    vH_02[0]._0_4_ = in_stack_fffffffffffffc28;
                    vH_02[1] = (longlong)palVar28;
                    vH_02[2] = (longlong)palVar26;
                    vH_02[3] = (longlong)palVar27;
                    palVar25 = palVar26;
                    arr_store(*((result->field_4).trace)->trace_del_table,vH_02,iVar35,seglen,iVar22
                              ,s2Len);
                    auVar12._4_4_ = open;
                    auVar12._0_4_ = open;
                    auVar12._8_4_ = open;
                    auVar12._12_4_ = open;
                    auVar12._16_4_ = open;
                    auVar12._20_4_ = open;
                    auVar12._24_4_ = open;
                    auVar12._28_4_ = open;
                    auVar14 = vpsubd_avx2(auVar16,auVar12);
                    auVar18._4_4_ = gap;
                    auVar18._0_4_ = gap;
                    auVar18._8_4_ = gap;
                    auVar18._12_4_ = gap;
                    auVar18._16_4_ = gap;
                    auVar18._20_4_ = gap;
                    auVar18._24_4_ = gap;
                    auVar18._28_4_ = gap;
                    auVar17 = vpsubd_avx2(auVar47,auVar18);
                    auVar12 = vpcmpgtd_avx2(auVar14,auVar17);
                    auVar41 = vblendvps_avx(auVar67,auVar15,auVar12);
                    local_318 = vpmaxsd_avx2(auVar16,local_318);
                    auVar45 = vblendvps_avx(auVar5,auVar51,auVar12);
                    auVar47 = vpcmpeqd_avx2(auVar65,auVar65);
                    auVar67 = vpsubd_avx2(auVar6,auVar47);
                    auVar5 = vpsubd_avx2(auVar46,auVar47);
                    auVar47 = vpcmpeqd_avx2(auVar46,auVar46);
                    auVar46 = vblendvps_avx(auVar67,auVar5,auVar12);
                    auVar67 = vpmaxsd_avx2(auVar14,auVar17);
                    *(undefined1 (*) [32])((long)*b + lVar38) = auVar67;
                    *(undefined1 (*) [32])((long)*b_00 + lVar38) = auVar41;
                    *(undefined1 (*) [32])((long)*b_01 + lVar38) = auVar45;
                    *(undefined1 (*) [32])((long)*b_02 + lVar38) = auVar46;
                    auVar46 = vpsubd_avx2(auVar64,auVar18);
                    auVar66 = ZEXT3264(auVar13);
                    auVar45 = vpcmpgtd_avx2(auVar14,auVar46);
                    auVar41 = vblendvps_avx(auVar52._0_32_,auVar15,auVar45);
                    auVar52 = ZEXT3264(auVar41);
                    auVar41 = vpmaxsd_avx2(auVar14,auVar46);
                    auVar48 = ZEXT3264(auVar41);
                    auVar41 = vblendvps_avx(auVar68._0_32_,auVar51,auVar45);
                    auVar68 = ZEXT3264(auVar41);
                    auVar41 = vpsubd_avx2(auVar11,auVar47);
                    auVar11 = vblendvps_avx(auVar41,auVar5,auVar45);
                    auVar41 = *(undefined1 (*) [32])((long)*local_388 + lVar38);
                    auVar45 = *(undefined1 (*) [32])((long)*local_3b0 + lVar38);
                    auVar46 = *(undefined1 (*) [32])((long)*local_3b8 + lVar38);
                    auVar51 = *(undefined1 (*) [32])((long)*palVar27 + lVar38);
                    iVar35 = iVar35 + 1;
                  }
                  if ((int)local_360 == iVar21) {
                    palVar28 = local_368;
                    local_370 = palVar26;
                  }
                  for (iVar21 = 0; iVar21 != 8; iVar21 = iVar21 + 1) {
                    alVar1 = local_388[uVar20];
                    auVar41 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28
                                             );
                    auVar41 = vpalignr_avx2((undefined1  [32])alVar1,auVar41,0xc);
                    auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                    auVar45 = vpermd_avx2(auVar51,auVar48._0_32_);
                    auVar47 = vpblendd_avx2(auVar45,ZEXT432((uint)-open),1);
                    auVar46 = auVar52._0_32_;
                    auVar45 = vperm2i128_avx2(auVar46,auVar46,0x28);
                    auVar45 = vpalignr_avx2(auVar46,auVar45,0xc);
                    auVar67 = auVar68._0_32_;
                    auVar46 = vperm2i128_avx2(auVar67,auVar67,0x28);
                    auVar46 = vpalignr_avx2(auVar67,auVar46,0xc);
                    auVar51 = vpermd_avx2(auVar51,auVar11);
                    auVar11 = vpblendd_avx2(auVar51,ZEXT432(1),1);
                    lVar38 = 0;
                    uVar36 = 0;
                    while( true ) {
                      auVar48 = ZEXT3264(auVar47);
                      auVar68 = ZEXT3264(auVar46);
                      auVar52 = ZEXT3264(auVar45);
                      if (uVar37 == uVar36) break;
                      auVar41 = vpaddd_avx2(auVar41,*(undefined1 (*) [32])
                                                     ((long)pvVar7 + lVar38 + lVar30));
                      auVar51 = vpmaxsd_avx2(auVar41,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar41 = *(undefined1 (*) [32])((long)*palVar24 + lVar38);
                      auVar5 = vpmaxsd_avx2(auVar41,auVar47);
                      *(undefined1 (*) [32])((long)*palVar24 + lVar38) = auVar5;
                      auVar51 = vpcmpeqd_avx2(auVar5,auVar51);
                      auVar41 = vpcmpgtd_avx2(auVar41,auVar47);
                      auVar67 = vpor_avx2(auVar51,auVar41);
                      auVar41 = vblendvps_avx(auVar45,*(undefined1 (*) [32])
                                                       ((long)*local_390 + lVar38),auVar67);
                      *(undefined1 (*) [32])((long)*local_390 + lVar38) = auVar41;
                      auVar51 = vblendvps_avx(auVar46,*(undefined1 (*) [32])
                                                       ((long)*local_398 + lVar38),auVar67);
                      *(undefined1 (*) [32])((long)*local_398 + lVar38) = auVar51;
                      auVar67 = vblendvps_avx(auVar11,*(undefined1 (*) [32])
                                                       ((long)*palVar32 + lVar38),auVar67);
                      *(undefined1 (*) [32])((long)*palVar32 + lVar38) = auVar67;
                      auVar6 = vpmaxsd_avx2(auVar66._0_32_,auVar41);
                      auVar15 = vpmaxsd_avx2(auVar51,auVar67);
                      auVar12 = vpmaxsd_avx2(auVar6,auVar15);
                      iVar35 = (int32_t)uVar36;
                      vH_03[0]._4_4_ = iVar69;
                      vH_03[0]._0_4_ = in_stack_fffffffffffffc28;
                      vH_03[1] = (longlong)palVar28;
                      vH_03[2] = (longlong)palVar25;
                      vH_03[3] = (longlong)palVar27;
                      arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 8),
                                vH_03,iVar35,seglen,iVar22,s2Len);
                      vH_04[0]._4_4_ = iVar69;
                      vH_04[0]._0_4_ = in_stack_fffffffffffffc28;
                      vH_04[1] = (longlong)palVar28;
                      vH_04[2] = (longlong)palVar25;
                      vH_04[3] = (longlong)palVar27;
                      arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x10),
                                vH_04,iVar35,seglen,iVar22,s2Len);
                      vH_05[0]._4_4_ = iVar69;
                      vH_05[0]._0_4_ = in_stack_fffffffffffffc28;
                      vH_05[1] = (longlong)palVar28;
                      vH_05[2] = (longlong)palVar25;
                      vH_05[3] = (longlong)palVar27;
                      arr_store(*(int **)((long)((result->field_4).trace)->trace_del_table + 0x18),
                                vH_05,iVar35,seglen,iVar22,s2Len);
                      vH_06[0]._4_4_ = iVar69;
                      vH_06[0]._0_4_ = in_stack_fffffffffffffc28;
                      vH_06[1] = (longlong)palVar28;
                      vH_06[2] = (longlong)palVar25;
                      vH_06[3] = (longlong)palVar27;
                      arr_store(*((result->field_4).trace)->trace_del_table,vH_06,iVar35,seglen,
                                iVar22,s2Len);
                      local_318 = vpmaxsd_avx2(auVar5,local_318);
                      auVar6._4_4_ = open;
                      auVar6._0_4_ = open;
                      auVar6._8_4_ = open;
                      auVar6._12_4_ = open;
                      auVar6._16_4_ = open;
                      auVar6._20_4_ = open;
                      auVar6._24_4_ = open;
                      auVar6._28_4_ = open;
                      auVar13 = vpsubd_avx2(auVar5,auVar6);
                      auVar5._4_4_ = gap;
                      auVar5._0_4_ = gap;
                      auVar5._8_4_ = gap;
                      auVar5._12_4_ = gap;
                      auVar5._16_4_ = gap;
                      auVar5._20_4_ = gap;
                      auVar5._24_4_ = gap;
                      auVar5._28_4_ = gap;
                      auVar47 = vpsubd_avx2(auVar47,auVar5);
                      auVar6 = vpcmpgtd_avx2(auVar47,auVar13);
                      auVar5 = vpcmpeqd_avx2(auVar47,auVar13);
                      auVar15 = vpcmpgtd_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar5 = vpand_avx2(auVar5,auVar15);
                      auVar5 = vpor_avx2(auVar5,auVar6);
                      if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                              (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar5 >> 0x7f,0) == '\0') &&
                            (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar5 >> 0xbf,0) == '\0') &&
                          (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar5[0x1f]) {
                        auVar66 = ZEXT3264(auVar12);
                        goto LAB_00799a29;
                      }
                      auVar5 = vpcmpgtd_avx2(auVar13,auVar47);
                      auVar45 = vblendvps_avx(auVar45,auVar41,auVar5);
                      auVar46 = vblendvps_avx(auVar46,auVar51,auVar5);
                      auVar41 = vblendvps_avx(auVar11,auVar67,auVar5);
                      auVar11 = vpsubd_avx2(auVar41,_DAT_008a5a80);
                      auVar41 = *(undefined1 (*) [32])((long)*local_388 + lVar38);
                      uVar36 = uVar36 + 1;
                      lVar38 = lVar38 + 0x20;
                      auVar66 = ZEXT3264(auVar12);
                    }
                  }
LAB_00799a29:
                  auVar41 = auVar66._0_32_;
                  auVar52 = ZEXT3264(local_318);
                  auVar45 = vpcmpgtd_avx2(local_318,auVar42);
                  palVar26 = local_3b8;
                  local_368 = local_388;
                  palVar25 = local_3b0;
                  local_3a0 = palVar32;
                  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar45 >> 0x7f,0) != '\0') ||
                        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar45 >> 0xbf,0) != '\0') ||
                      (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar45[0x1f] < '\0') {
                    auVar45 = vpermq_avx2(local_318,0x44);
                    auVar45 = vpmaxsd_avx2(local_318,auVar45);
                    auVar46 = vpslldq_avx2(auVar45,8);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                    auVar46 = vpslldq_avx2(auVar45,4);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                    iVar69 = auVar45._28_4_;
                    if (0x7ffffffe - iVar29 < iVar69) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      s2Len = iVar22;
                      local_388 = palVar24;
                      goto LAB_00799bb1;
                    }
                    auVar47._8_4_ = 7;
                    auVar47._0_8_ = 0x700000007;
                    auVar47._12_4_ = 7;
                    auVar47._16_4_ = 7;
                    auVar47._20_4_ = 7;
                    auVar47._24_4_ = 7;
                    auVar47._28_4_ = 7;
                    auVar42 = vpermd_avx2(auVar47,auVar45);
                    local_360 = uVar33 & 0xffffffff;
                  }
                  auVar48 = ZEXT3264(auVar42);
                  uVar33 = uVar33 + 1;
                  local_3b8 = local_398;
                  local_3b0 = local_390;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_table_striped_profile_avx2_256_32",pcVar31);
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile32.score;
    vProfileM = (__m256i*)profile->profile32.matches;
    vProfileS = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm256_set1_epi32(INT32_MAX);
    maxp = INT32_MAX - (int32_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);
        vHM = _mm256_slli_si256_rpl(vHM, 4);
        vHS = _mm256_slli_si256_rpl(vHS, 4);
        vHL = _mm256_slli_si256_rpl(vHL, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH_dag = _mm256_max_epi32(vH_dag, vZero);
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi32(vH, vZero);

            case1 = _mm256_cmpeq_epi32(vH, vH_dag);
            case2 = _mm256_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi32(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_andnot_si256(cond_zero, vHM);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi32(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_andnot_si256(cond_zero, vHS);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi32(vHL, vOne), case1);
            vHL = _mm256_andnot_si256(cond_zero, vHL);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vEL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vFL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, -open, 0);
            vFM = _mm256_slli_si256_rpl(vFM, 4);
            vFS = _mm256_slli_si256_rpl(vFS, 4);
            vFL = _mm256_slli_si256_rpl(vFL, 4);
            vFL = _mm256_insert_epi32_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                vHp = _mm256_max_epi32(vHp, vZero);
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi32(vH, vHp);
                case2 = _mm256_cmpeq_epi32(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi32(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi32(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi32(vFL, vOne),
                        _mm256_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT32_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi32(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t *m = (int32_t*)pvHMMax;
            int32_t *s = (int32_t*)pvHSMax;
            int32_t *l = (int32_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}